

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

_Bool ts_node_has_error(TSNode self)

{
  ulong uVar1;
  int iVar2;
  
  uVar1 = *self.id;
  if ((uVar1 & 1) == 0) {
    iVar2 = 0x262;
    if ((*(byte *)(uVar1 + 0x2c) & 0x80) == 0) {
      iVar2 = *(int *)(uVar1 + 0x20);
    }
  }
  else {
    iVar2 = 0x262;
    if ((uVar1 & 0x20) == 0) {
      iVar2 = 0;
    }
  }
  return iVar2 != 0;
}

Assistant:

bool ts_node_has_error(TSNode self) {
  return ts_subtree_error_cost(ts_node__subtree(self)) > 0;
}